

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  istream *piVar1;
  double __x;
  Experiment experiment;
  Short step;
  Short k;
  string s;
  ofstream out;
  Experiment local_235 [5];
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_220;
  undefined7 uStack_21f;
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  local_228 = 0;
  local_220 = 0;
  local_230 = &local_220;
  piVar1 = std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
  piVar1 = std::istream::_M_extract<unsigned_short>((ushort *)piVar1);
  std::operator>>(piVar1,(string *)&local_230);
  std::ofstream::ofstream(&local_210,(string *)&local_230,_S_out);
  Experiment::Experiment(local_235);
  Experiment::exp(local_235,__x);
  Experiment::~Experiment(local_235);
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  if (local_230 != &local_220) {
    operator_delete(local_230,CONCAT71(uStack_21f,local_220) + 1);
  }
  return 0;
}

Assistant:

int main()
{
    Num::Short k;
    Num::Short step;
    std::string s;

    std::cin>>k>>step>>s;
    std::ofstream out(s);

    Experiment experiment;
    experiment.exp(k,step, out);
}